

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMerge.c
# Opt level: O2

void Nwk_ManGraphFree(Nwk_Grf_t *p)

{
  Vec_Int_t *__ptr;
  
  __ptr = p->vPairs;
  if (__ptr != (Vec_Int_t *)0x0) {
    free(__ptr->pArray);
    free(__ptr);
  }
  if (p->pMemEdges != (Aig_MmFixed_t *)0x0) {
    Aig_MmFixedStop(p->pMemEdges,0);
  }
  if (p->pMemVerts != (Aig_MmFlex_t *)0x0) {
    Aig_MmFlexStop(p->pMemVerts,0);
  }
  if (p->pVerts != (Nwk_Vrt_t **)0x0) {
    free(p->pVerts);
    p->pVerts = (Nwk_Vrt_t **)0x0;
  }
  if (p->pEdgeHash != (Nwk_Edg_t **)0x0) {
    free(p->pEdgeHash);
    p->pEdgeHash = (Nwk_Edg_t **)0x0;
  }
  if (p->pMapLut2Id != (int *)0x0) {
    free(p->pMapLut2Id);
    p->pMapLut2Id = (int *)0x0;
  }
  free(p->pMapId2Lut);
  free(p);
  return;
}

Assistant:

void Nwk_ManGraphFree( Nwk_Grf_t * p )
{
    if ( p->vPairs )    Vec_IntFree( p->vPairs );
    if ( p->pMemEdges ) Aig_MmFixedStop( p->pMemEdges, 0 );
    if ( p->pMemVerts ) Aig_MmFlexStop( p->pMemVerts, 0 );
    ABC_FREE( p->pVerts );
    ABC_FREE( p->pEdgeHash );
    ABC_FREE( p->pMapLut2Id );
    ABC_FREE( p->pMapId2Lut );
    ABC_FREE( p );
}